

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

int __thiscall crnlib::dynamic_string::find_right(dynamic_string *this,char *p,bool case_sensitive)

{
  int iVar1;
  size_t sVar2;
  byte in_DL;
  char *in_RSI;
  long in_RDI;
  int i;
  int p_len;
  code *local_38;
  int local_24;
  
  sVar2 = strlen(in_RSI);
  local_24 = (uint)*(ushort *)(in_RDI + 2) - (int)sVar2;
  while( true ) {
    if (local_24 < 0) {
      return -1;
    }
    if ((in_DL & 1) == 0) {
      local_38 = strncasecmp;
    }
    else {
      local_38 = strncmp;
    }
    iVar1 = (*local_38)(in_RSI,*(long *)(in_RDI + 8) + (long)local_24,(long)(int)sVar2);
    if (iVar1 == 0) break;
    local_24 = local_24 + -1;
  }
  return local_24;
}

Assistant:

int dynamic_string::find_right(const char* p, bool case_sensitive) const {
  CRNLIB_ASSERT(p);
  const int p_len = (int)strlen(p);

  for (int i = m_len - p_len; i >= 0; i--)
    if ((case_sensitive ? strncmp : crnlib_strnicmp)(p, &m_pStr[i], p_len) == 0)
      return i;

  return -1;
}